

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

void __thiscall juzzlin::SimpleLogger::Impl::Impl(Impl *this)

{
  undefined4 *in_RDI;
  mutex_type *in_stack_ffffffffffffffc8;
  
  *in_RDI = 2;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)(in_RDI + 2),in_stack_ffffffffffffffc8);
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 0xc));
  return;
}

Assistant:

SimpleLogger::Impl::Impl()
  : m_lock(m_mutex)
{
}